

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void is_suite::is_real_with_double(void)

{
  undefined1 local_82;
  undefined1 local_81 [2];
  undefined1 local_7f;
  undefined1 local_7e [2];
  undefined1 local_7c;
  undefined1 local_7b [2];
  undefined1 local_79;
  undefined1 local_78 [2];
  undefined1 local_76;
  undefined1 local_75 [2];
  undefined1 local_73;
  undefined1 local_72 [2];
  undefined1 local_70;
  undefined1 local_6f [2];
  undefined1 local_6d;
  undefined1 local_6c [2];
  undefined1 local_6a;
  undefined1 local_69 [2];
  undefined1 local_67;
  undefined1 local_66 [2];
  undefined1 local_64;
  undefined1 local_63 [2];
  undefined1 local_61;
  undefined1 local_60 [2];
  undefined1 local_5e;
  undefined1 local_5d [2];
  undefined1 local_5b;
  undefined1 local_5a [2];
  undefined1 local_58;
  undefined1 local_57 [2];
  undefined1 local_55;
  undefined1 local_54 [2];
  undefined1 local_52;
  undefined1 local_51 [2];
  undefined1 local_4f;
  undefined1 local_4e [19];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_38,1.0);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::real>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<real>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x456,"void is_suite::is_real_with_double()",local_3a,&local_3b);
  local_4e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<double>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_4f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x458,"void is_suite::is_real_with_double()",local_4e,&local_4f);
  local_51[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<double&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_52 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<double&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x459,"void is_suite::is_real_with_double()",local_51,&local_52);
  local_54[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<double_const>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_55 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x45a,"void is_suite::is_real_with_double()",local_54,&local_55);
  local_57[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<double_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_58 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const double&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x45b,"void is_suite::is_real_with_double()",local_57,&local_58);
  local_5a[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<double_volatile>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_5b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<volatile double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x45c,"void is_suite::is_real_with_double()",local_5a,&local_5b);
  local_5d[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<double_volatile&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_5e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<volatile double&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x45d,"void is_suite::is_real_with_double()",local_5d,&local_5e);
  local_60[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_61 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x45f,"void is_suite::is_real_with_double()",local_60,&local_61);
  local_63[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<float_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_64 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const float&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x460,"void is_suite::is_real_with_double()",local_63,&local_64);
  local_66[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<long_double>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_67 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<long double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x461,"void is_suite::is_real_with_double()",local_66,&local_67);
  local_69[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<long_double_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_6a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const long double&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x462,"void is_suite::is_real_with_double()",local_69,&local_6a);
  local_6c[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_6d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x464,"void is_suite::is_real_with_double()",local_6c,&local_6d);
  local_6f[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<double&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_70 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x465,"void is_suite::is_real_with_double()",local_6f,&local_70);
  local_72[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<double_const>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_73 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<const double>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x466,"void is_suite::is_real_with_double()",local_72,&local_73);
  local_75[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<double_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_76 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<const double&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x467,"void is_suite::is_real_with_double()",local_75,&local_76);
  local_78[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<double_volatile>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_79 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<volatile double>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x468,"void is_suite::is_real_with_double()",local_78,&local_79);
  local_7b[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<double_volatile&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_7c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<volatile double&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x469,"void is_suite::is_real_with_double()",local_7b,&local_7c);
  local_7e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_7f = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x46b,"void is_suite::is_real_with_double()",local_7e,&local_7f);
  local_81[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_double>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_82 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<long double>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x46c,"void is_suite::is_real_with_double()",local_81,&local_82);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void is_real_with_double()
{
    variable data(1.0);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<real>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<double>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<double&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const double>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const double&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<volatile double>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<volatile double&>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<float>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const float&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<long double>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const long double&>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<double&>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<const double>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<const double&>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<volatile double>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<volatile double&>(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<long double>(), false);
}